

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall crypto_tests::hmac_sha256_testvectors::test_method(hmac_sha256_testvectors *this)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  allocator<char> *in_stack_fffffffffffffbb8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbc0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffbd8;
  string *hexout;
  string *in_stack_fffffffffffffbe0;
  string *hexin;
  string *in_stack_fffffffffffffbe8;
  string *hexkey;
  CryptoTest *in_stack_fffffffffffffbf0;
  CryptoTest *this_01;
  allocator<char> local_383;
  allocator<char> local_382;
  allocator<char> local_381;
  allocator<char> local_380;
  allocator<char> local_37f;
  allocator<char> local_37e;
  allocator<char> local_37d;
  allocator<char> local_37c;
  allocator<char> local_37b;
  undefined1 local_37a [2];
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  undefined1 local_375 [2];
  allocator<char> local_373;
  allocator<char> local_372;
  allocator<char> local_371;
  allocator<char> local_370;
  allocator<char> local_36f;
  allocator<char> local_36e;
  allocator<char> local_36d;
  allocator<char> local_36c;
  allocator<char> local_36b;
  allocator<char> local_36a;
  allocator<char> local_369 [865];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36b);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36a);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36e);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36d);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_370);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_36f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)(local_375 + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_373);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_372);
  this_01 = (CryptoTest *)local_375;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  hexkey = (string *)&local_376;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  hexin = (string *)&local_377;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256(this_01,hexkey,hexin,in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)&local_377);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)&local_376);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)local_375);
  hexout = (string *)&local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_37a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  CryptoTest::TestHMACSHA256(this_01,hexkey,hexin,hexout);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)local_37a);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)(local_37a + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator((allocator<char> *)&local_378);
  __s = &local_37b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffbb8);
  __a = &local_37c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CryptoTest::TestHMACSHA256(this_01,hexkey,hexin,hexout);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_37d);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_37c);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_37b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CryptoTest::TestHMACSHA256(this_01,hexkey,hexin,hexout);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_380);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_37f);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_37e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CryptoTest::TestHMACSHA256(this_01,hexkey,hexin,hexout);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_383);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_382);
  std::__cxx11::string::~string(in_stack_fffffffffffffb78);
  std::allocator<char>::~allocator(&local_381);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(hmac_sha256_testvectors) {
    // test cases 1, 2, 3, 4, 6 and 7 of RFC 4231
    TestHMACSHA256("0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",
                   "4869205468657265",
                   "b0344c61d8db38535ca8afceaf0bf12b881dc200c9833da726e9376c2e32cff7");
    TestHMACSHA256("4a656665",
                   "7768617420646f2079612077616e7420666f72206e6f7468696e673f",
                   "5bdcc146bf60754e6a042426089575c75a003f089d2739839dec58b964ec3843");
    TestHMACSHA256("aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa",
                   "dddddddddddddddddddddddddddddddddddddddddddddddddddddddddddddddd"
                   "dddddddddddddddddddddddddddddddddddd",
                   "773ea91e36800e46854db8ebd09181a72959098b3ef8c122d9635514ced565fe");
    TestHMACSHA256("0102030405060708090a0b0c0d0e0f10111213141516171819",
                   "cdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcd"
                   "cdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcdcd",
                   "82558a389a443c0ea4cc819899f2083a85f0faa3e578f8077a2e3ff46729665b");
    TestHMACSHA256("aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaa",
                   "54657374205573696e67204c6172676572205468616e20426c6f636b2d53697a"
                   "65204b6579202d2048617368204b6579204669727374",
                   "60e431591ee0b67f0d8a26aacbf5b77f8e0bc6213728c5140546040f0ee37f54");
    TestHMACSHA256("aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                   "aaaaaa",
                   "5468697320697320612074657374207573696e672061206c6172676572207468"
                   "616e20626c6f636b2d73697a65206b657920616e642061206c61726765722074"
                   "68616e20626c6f636b2d73697a6520646174612e20546865206b6579206e6565"
                   "647320746f20626520686173686564206265666f7265206265696e6720757365"
                   "642062792074686520484d414320616c676f726974686d2e",
                   "9b09ffa71b942fcb27635fbcd5b0e944bfdc63644f0713938a7f51535c3a35e2");
    // Test case with key length 63 bytes.
    TestHMACSHA256("4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a656665"
                   "4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a6566",
                   "7768617420646f2079612077616e7420666f72206e6f7468696e673f",
                   "9de4b546756c83516720a4ad7fe7bdbeac4298c6fdd82b15f895a6d10b0769a6");
    // Test case with key length 64 bytes.
    TestHMACSHA256("4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a656665"
                   "4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a656665",
                   "7768617420646f2079612077616e7420666f72206e6f7468696e673f",
                   "528c609a4c9254c274585334946b7c2661bad8f1fc406b20f6892478d19163dd");
    // Test case with key length 65 bytes.
    TestHMACSHA256("4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a656665"
                   "4a6566654a6566654a6566654a6566654a6566654a6566654a6566654a656665"
                   "4a",
                   "7768617420646f2079612077616e7420666f72206e6f7468696e673f",
                   "d06af337f359a2330deffb8e3cbe4b5b7aa8ca1f208528cdbd245d5dc63c4483");
}